

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethswitch.cpp
# Opt level: O0

char * PrintFpgaList(uint16_t fpgaList)

{
  byte bVar1;
  char *pcVar2;
  ulong local_20;
  size_t i;
  char *p;
  uint16_t fpgaList_local;
  
  i = (size_t)PrintFpgaList::buffer;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    bVar1 = (byte)local_20;
    if (((uint)fpgaList & 1 << (bVar1 & 0x1f)) != 0) {
      if ((char *)i != PrintFpgaList::buffer) {
        *(undefined1 *)i = 0x20;
        i = i + 1;
      }
      if (local_20 < 10) {
        *(byte *)i = bVar1 + 0x30;
        i = i + 1;
      }
      else {
        pcVar2 = (char *)(i + 1);
        *(undefined1 *)i = 0x31;
        i = i + 2;
        *pcVar2 = bVar1 + 0x26;
      }
    }
  }
  *(undefined1 *)i = 0;
  return PrintFpgaList::buffer;
}

Assistant:

const char *PrintFpgaList(uint16_t fpgaList)
{
    static char buffer[128];
    char *p = buffer;
    for (size_t i = 0; i < 16; i++) {
        if (fpgaList & (1<<i)) {
            if (p != buffer)
                *p++ = ' ';
            if (i < 10) {
                *p++ = '0'+i;
            }
            else {
                *p++ = '1';
                *p++ = '0'+(i-10);
            }
        }
    }
    *p = 0;
    return buffer;
}